

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::internal::bigint::square(bigint *this)

{
  int iVar1;
  size_t sVar2;
  uint *puVar3;
  buffer<unsigned_int> *in_RDI;
  bool bVar4;
  int i_1;
  int j_1;
  int bigit_index_1;
  int j;
  int i;
  int bigit_index;
  accumulator_t sum;
  int num_result_bigits;
  int num_bigits;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint uVar5;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> local_a8;
  
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            (in_stack_fffffffffffffee0,
             (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  sVar2 = buffer<unsigned_int>::size(in_RDI);
  iVar1 = (int)sVar2;
  buffer<unsigned_int>::resize
            (&in_stack_fffffffffffffee0->super_buffer<unsigned_int>,
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_d0 = 0;
  local_d8 = 0;
  for (local_dc = 0; local_e8 = iVar1, local_dc < iVar1; local_dc = local_dc + 1) {
    local_e0 = 0;
    for (local_e4 = local_dc; -1 < local_e4; local_e4 = local_e4 + -1) {
      puVar3 = buffer<unsigned_int>::operator[](&local_a8.super_buffer<unsigned_int>,(long)local_e0)
      ;
      uVar5 = *puVar3;
      puVar3 = buffer<unsigned_int>::operator[](&local_a8.super_buffer<unsigned_int>,(long)local_e4)
      ;
      bVar4 = CARRY8(local_d8,(ulong)uVar5 * (ulong)*puVar3);
      local_d8 = local_d8 + (ulong)uVar5 * (ulong)*puVar3;
      local_d0 = local_d0 + bVar4;
      local_e0 = local_e0 + 1;
    }
    in_stack_fffffffffffffef4 = (uint)local_d8;
    puVar3 = buffer<unsigned_int>::operator[](in_RDI,(long)local_dc);
    *puVar3 = in_stack_fffffffffffffef4;
    local_d8 = local_d0 << 0x20 | local_d8 >> 0x20;
    local_d0 = local_d0 >> 0x20;
  }
  for (; local_e8 < iVar1 * 2; local_e8 = local_e8 + 1) {
    local_ec = iVar1 + -1;
    local_f0 = local_e8 - local_ec;
    while (local_f0 < iVar1) {
      sVar2 = (size_t)local_f0;
      local_f0 = local_f0 + 1;
      in_stack_fffffffffffffee0 = &local_a8;
      puVar3 = buffer<unsigned_int>::operator[]
                         (&in_stack_fffffffffffffee0->super_buffer<unsigned_int>,sVar2);
      uVar5 = *puVar3;
      sVar2 = (size_t)local_ec;
      local_ec = local_ec + -1;
      puVar3 = buffer<unsigned_int>::operator[]
                         (&in_stack_fffffffffffffee0->super_buffer<unsigned_int>,sVar2);
      bVar4 = CARRY8(local_d8,(ulong)uVar5 * (ulong)*puVar3);
      local_d8 = local_d8 + (ulong)uVar5 * (ulong)*puVar3;
      local_d0 = local_d0 + bVar4;
    }
    uVar5 = (uint)local_d8;
    puVar3 = buffer<unsigned_int>::operator[](in_RDI,(long)local_e8);
    *puVar3 = uVar5;
    local_d8 = local_d0 << 0x20 | local_d8 >> 0x20;
    local_d0 = local_d0 >> 0x20;
  }
  remove_leading_zeros((bigint *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  *(int *)&in_RDI[5]._vptr_buffer = *(int *)&in_RDI[5]._vptr_buffer << 1;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::~basic_memory_buffer
            (in_stack_fffffffffffffee0);
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(num_result_bigits);
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      bigits_[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      bigits_[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }